

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void issue208b(void)

{
  roaring_bitmap_t *r;
  uint64_t uVar1;
  uint32_t i;
  uint32_t uVar2;
  uint val;
  int iVar3;
  uint32_t i_2;
  bool bVar4;
  
  r = roaring_bitmap_create();
  for (uVar2 = 0xffc0; uVar2 != 0x10000; uVar2 = uVar2 + 1) {
    roaring_bitmap_add(r,uVar2);
  }
  for (val = 0; val < 0x2004; val = val + 2) {
    roaring_bitmap_add(r,val);
  }
  uVar2 = 0xffc0;
  iVar3 = 0x40;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    uVar1 = roaring_bitmap_rank(r,uVar2);
    _assert_true((ulong)(uVar2 - 0xefbd == (int)uVar1),"rank == expected",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x147);
    uVar2 = uVar2 + 1;
  }
  roaring_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(issue208b) {
    roaring_bitmap_t *r = roaring_bitmap_create();
    for (uint32_t i = 65536 - 64; i < 65536; i++) {
        roaring_bitmap_add(r, i);
    }
    for (uint32_t i = 0; i < 8196; i += 2) {
        roaring_bitmap_add(r, i);
    }
    for (uint32_t i = 65536 - 64; i < 65536; i++) {
        uint32_t expected = i - (65536 - 64) + 8196 / 2 + 1;
        uint32_t rank = roaring_bitmap_rank(r, i);
        assert_true(rank == expected);
    }
    roaring_bitmap_free(r);
}